

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O2

Variant __thiscall cali::Entry::value(Entry *this,cali_id_t attr_id)

{
  cali_variant_t *pcVar1;
  Node *pNVar2;
  Variant *pVVar3;
  Variant VVar4;
  
  pNVar2 = this->m_node;
  if ((pNVar2 == (Node *)0x0) || (pNVar2->m_id != attr_id)) {
    while( true ) {
      if (pNVar2 == (Node *)0x0) {
        return (cali_variant_t)ZEXT816(0);
      }
      if (pNVar2->m_attribute == attr_id) break;
      pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                 super_LockfreeIntrusiveTree<cali::Node>).m_me +
                         (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
    }
    pVVar3 = &pNVar2->m_data;
    pcVar1 = &(pNVar2->m_data).m_v;
  }
  else {
    pVVar3 = &this->m_value;
    pcVar1 = &(this->m_value).m_v;
  }
  VVar4.m_v.value.v_uint = (pcVar1->value).v_uint;
  VVar4.m_v.type_and_size = (pVVar3->m_v).type_and_size;
  return (Variant)VVar4.m_v;
}

Assistant:

Variant Entry::value(cali_id_t attr_id) const
{
    if (m_node && m_node->id() == attr_id)
        return m_value;

    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == attr_id)
            return node->data();

    return Variant();
}